

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O0

void __thiscall PF_HashTable::PF_HashTable(PF_HashTable *this,int _numBuckets)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  PF_HashEntry **ppPVar3;
  int local_18;
  int i;
  int _numBuckets_local;
  PF_HashTable *this_local;
  
  this->numBuckets = _numBuckets;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->numBuckets;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppPVar3 = (PF_HashEntry **)operator_new__(uVar2);
  this->hashTable = ppPVar3;
  for (local_18 = 0; local_18 < this->numBuckets; local_18 = local_18 + 1) {
    this->hashTable[local_18] = (PF_HashEntry *)0x0;
  }
  return;
}

Assistant:

PF_HashTable::PF_HashTable(int _numBuckets)
{
  // Initialize numBuckets local variable from parameter
  this->numBuckets = _numBuckets;

  // Allocate memory for hash table
  hashTable = new PF_HashEntry* [numBuckets];

  // Initialize all buckets to empty
  for (int i = 0; i < numBuckets; i++)
    hashTable[i] = NULL;
}